

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitRefI31(BinaryInstWriter *this,RefI31 *curr)

{
  bool bVar1;
  BufferWithRandomAccess *this_00;
  HeapType local_20;
  
  this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
  local_20 = wasm::Type::getHeapType
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression
                         .type);
  bVar1 = HeapType::isShared(&local_20);
  BufferWithRandomAccess::operator<<(this_00,(U32LEB)((uint)bVar1 + (uint)bVar1 * 2 + 0x1c));
  return;
}

Assistant:

void BinaryInstWriter::visitRefI31(RefI31* curr) {
  o << int8_t(BinaryConsts::GCPrefix)
    << U32LEB(curr->type.getHeapType().isShared() ? BinaryConsts::RefI31Shared
                                                  : BinaryConsts::RefI31);
}